

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O1

ostream * Omega_h::operator<<(ostream *os,Grammar *g)

{
  pointer pbVar1;
  int *piVar2;
  ostream *poVar3;
  pointer pPVar4;
  long lVar5;
  int *symb;
  int *piVar6;
  long lVar7;
  char local_3b [3];
  Grammar *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"symbols:\n",9);
  if (0 < (int)((ulong)((long)(g->symbol_names).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(g->symbol_names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    lVar5 = 8;
    lVar7 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,(int)lVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      pbVar1 = (g->symbol_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(g->symbol_names).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5) <=
          lVar7) {
        fail("assertion %s failed at %s +%d\n","i < int(v.size())",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,0x1e);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)((long)pbVar1 + lVar5 + -8),
                          *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar7 < (int)((ulong)((long)(g->symbol_names).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(g->symbol_names).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"productions:\n",0xd);
  pPVar4 = (g->productions).
           super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = g;
  if (0 < (int)((ulong)((long)(g->productions).
                              super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) >> 5)) {
    lVar5 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pPVar4[lVar5].lhs);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ::=",4);
      piVar2 = *(pointer *)
                ((long)&pPVar4[lVar5].rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
      ;
      for (piVar6 = *(int **)&pPVar4[lVar5].rhs.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl; piVar6 != piVar2; piVar6 = piVar6 + 1) {
        local_3b[1] = 0x20;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_3b + 1,1);
        std::ostream::operator<<((ostream *)poVar3,*piVar6);
      }
      local_3b[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,local_3b,1);
      lVar5 = lVar5 + 1;
      pPVar4 = (local_38->productions).
               super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(local_38->productions).
                                         super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4)
                          >> 5));
  }
  local_3b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3b + 2,1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Grammar const& g) {
  os << "symbols:\n";
  for (int i = 0; i < size(g.symbol_names); ++i) {
    os << i << ": " << at(g.symbol_names, i) << "\n";
  }
  os << "productions:\n";
  for (int i = 0; i < size(g.productions); ++i) {
    auto& prod = at(g.productions, i);
    os << i << ": " << prod.lhs << " ::=";
    for (auto& symb : prod.rhs) {
      os << ' ' << symb;
    }
    os << '\n';
  }
  os << '\n';
  return os;
}